

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_listener.c
# Opt level: O0

apx_serverEventListener_t * apx_serverEventListener_clone(apx_serverEventListener_t *other)

{
  apx_serverEventListener_t *self;
  apx_serverEventListener_t *other_local;
  
  if (other == (apx_serverEventListener_t *)0x0) {
    other_local = (apx_serverEventListener_t *)0x0;
  }
  else {
    other_local = (apx_serverEventListener_t *)malloc(0x18);
    if (other_local != (apx_serverEventListener_t *)0x0) {
      other_local->arg = other->arg;
      other_local->serverConnect1 = other->serverConnect1;
      other_local->serverDisconnect1 = other->serverDisconnect1;
    }
  }
  return other_local;
}

Assistant:

apx_serverEventListener_t *apx_serverEventListener_clone(apx_serverEventListener_t *other)
{
   if (other != 0)
   {
      apx_serverEventListener_t *self = (apx_serverEventListener_t*) malloc(sizeof(apx_serverEventListener_t));
      if (self != 0)
      {
         *self = *other;
      }
      return self;
   }
   return (apx_serverEventListener_t*) 0;
}